

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O2

void __thiscall
libtorrent::torrent_info::add_tracker(torrent_info *this,string *url,int tier,tracker_source source)

{
  pointer paVar1;
  __type_conflict1 _Var2;
  ulong uVar3;
  pointer paVar4;
  pointer paVar5;
  long lVar6;
  __normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
  __i;
  long lVar7;
  string_view u;
  announce_entry e;
  
  paVar4 = (this->m_urls).
           super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           .
           super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar1 = (this->m_urls).
           super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           .
           super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)paVar1 - (long)paVar4;
  for (lVar7 = lVar6 / 0x60 >> 2; 0 < lVar7; lVar7 = lVar7 + -1) {
    _Var2 = ::std::operator==(&paVar4->url,url);
    paVar5 = paVar4;
    if (_Var2) goto LAB_0031d522;
    _Var2 = ::std::operator==(&paVar4[1].url,url);
    paVar5 = paVar4 + 1;
    if (_Var2) goto LAB_0031d522;
    _Var2 = ::std::operator==(&paVar4[2].url,url);
    paVar5 = paVar4 + 2;
    if (_Var2) goto LAB_0031d522;
    _Var2 = ::std::operator==(&paVar4[3].url,url);
    paVar5 = paVar4 + 3;
    if (_Var2) goto LAB_0031d522;
    paVar4 = paVar4 + 4;
    lVar6 = lVar6 + -0x180;
  }
  lVar6 = lVar6 / 0x60;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      paVar5 = paVar1;
      if ((lVar6 != 3) || (_Var2 = ::std::operator==(&paVar4->url,url), paVar5 = paVar4, _Var2))
      goto LAB_0031d522;
      paVar4 = paVar4 + 1;
    }
    _Var2 = ::std::operator==(&paVar4->url,url);
    paVar5 = paVar4;
    if (_Var2) goto LAB_0031d522;
    paVar4 = paVar4 + 1;
  }
  _Var2 = ::std::operator==(&paVar4->url,url);
  paVar5 = paVar1;
  if (_Var2) {
    paVar5 = paVar4;
  }
LAB_0031d522:
  if (paVar5 == (this->m_urls).
                super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                .
                super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    u._M_str = (url->_M_dataplus)._M_p;
    u._M_len = url->_M_string_length;
    v1_2::announce_entry::announce_entry(&e,u);
    e.tier = (uint8_t)tier;
    e._90_1_ = e._90_1_ & 0xf0 | (byte)source & 0xf;
    ::std::
    vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>::
    push_back(&(this->m_urls).
               super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
              ,&e);
    paVar4 = (this->m_urls).
             super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             .
             super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar1 = (this->m_urls).
             super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             .
             super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (paVar4 != paVar1) {
      uVar3 = ((long)paVar1 - (long)paVar4) / 0x60;
      lVar6 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__1>>
                (paVar4,paVar1,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)paVar1 - (long)paVar4 < 0x601) {
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__1>>
                  (paVar4,paVar1);
      }
      else {
        paVar5 = paVar4 + 0x10;
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__1>>
                  (paVar4,paVar5);
        for (; paVar5 != paVar1; paVar5 = paVar5 + 1) {
          ::std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,__gnu_cxx::__ops::_Val_comp_iter<libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__1>>
                    (paVar5);
        }
      }
    }
    v1_2::announce_entry::~announce_entry(&e);
  }
  return;
}

Assistant:

void torrent_info::add_tracker(std::string const& url, int const tier
		, announce_entry::tracker_source const source)
	{
		TORRENT_ASSERT_PRECOND(!url.empty());
		auto const i = std::find_if(m_urls.begin(), m_urls.end()
			, [&url](announce_entry const& ae) { return ae.url == url; });
		if (i != m_urls.end()) return;

		announce_entry e(url);
		e.tier = std::uint8_t(tier);
		e.source = source;
		m_urls.push_back(e);

		std::sort(m_urls.begin(), m_urls.end()
			, [] (announce_entry const& lhs, announce_entry const& rhs)
			{ return lhs.tier < rhs.tier; });
	}